

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::WatWriter::FlushExprTree(WatWriter *this,ExprTree *expr_tree)

{
  TryKind TVar1;
  byte bVar2;
  bool bVar3;
  ExprType EVar4;
  Index IVar5;
  BlockExprBase<(wabt::ExprType)8> *pBVar6;
  BlockExprBase<(wabt::ExprType)27> *pBVar7;
  IfExpr *pIVar8;
  TryExpr *pTVar9;
  reference this_00;
  TryTableExpr *pTVar10;
  char *pcVar11;
  reference pTVar12;
  TableCatch *catch__1;
  const_iterator __end3;
  const_iterator __begin3;
  TryTableVector *__range3;
  bool has_label;
  TryTableExpr *try_table_expr;
  Catch *catch_;
  const_iterator __end4;
  const_iterator __begin4;
  CatchVector *__range4;
  TryExpr *try_expr;
  IfExpr *if_expr;
  ExprTree *expr_tree_local;
  WatWriter *this_local;
  
  EVar4 = Expr::type(expr_tree->expr);
  if (EVar4 == Block) {
    WritePuts(this,"(",None);
    pBVar6 = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(expr_tree->expr);
    pcVar11 = Opcode::GetName((Opcode *)&Opcode::Block_Opcode);
    WriteBeginBlock(this,Block,&pBVar6->block,pcVar11);
    pBVar6 = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(expr_tree->expr);
    WriteFoldedExprList(this,&(pBVar6->block).exprs);
    FlushExprTreeStack(this);
    WriteCloseNewline(this);
    ModuleContext::EndBlock(&this->super_ModuleContext);
  }
  else if (EVar4 == If) {
    pIVar8 = cast<wabt::IfExpr,wabt::Expr>(expr_tree->expr);
    WritePuts(this,"(",None);
    pcVar11 = Opcode::GetName((Opcode *)&Opcode::If_Opcode);
    WriteBeginBlock(this,If,&pIVar8->true_,pcVar11);
    FlushExprTreeVector(this,&expr_tree->children);
    WriteOpenNewline(this,"then");
    WriteFoldedExprList(this,&(pIVar8->true_).exprs);
    FlushExprTreeStack(this);
    WriteCloseNewline(this);
    bVar3 = intrusive_list<wabt::Expr>::empty(&pIVar8->false_);
    if (!bVar3) {
      WriteOpenNewline(this,"else");
      WriteFoldedExprList(this,&pIVar8->false_);
      FlushExprTreeStack(this);
      WriteCloseNewline(this);
    }
    WriteCloseNewline(this);
    ModuleContext::EndBlock(&this->super_ModuleContext);
  }
  else if (EVar4 == Loop) {
    WritePuts(this,"(",None);
    pBVar7 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(expr_tree->expr);
    pcVar11 = Opcode::GetName((Opcode *)&Opcode::Loop_Opcode);
    WriteBeginBlock(this,Loop,&pBVar7->block,pcVar11);
    pBVar7 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(expr_tree->expr);
    WriteFoldedExprList(this,&(pBVar7->block).exprs);
    FlushExprTreeStack(this);
    WriteCloseNewline(this);
    ModuleContext::EndBlock(&this->super_ModuleContext);
  }
  else if (EVar4 == Try) {
    pTVar9 = cast<wabt::TryExpr,wabt::Expr>(expr_tree->expr);
    WritePuts(this,"(",None);
    pcVar11 = Opcode::GetName((Opcode *)&Opcode::Try_Opcode);
    WriteBeginBlock(this,Try,&pTVar9->block,pcVar11);
    WriteOpenNewline(this,"do");
    FlushExprTreeVector(this,&expr_tree->children);
    WriteFoldedExprList(this,&(pTVar9->block).exprs);
    FlushExprTreeStack(this);
    WriteCloseNewline(this);
    TVar1 = pTVar9->kind;
    if (TVar1 != Plain) {
      if (TVar1 == Catch) {
        __end4 = std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::begin(&pTVar9->catches);
        catch_ = (Catch *)std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::end
                                    (&pTVar9->catches);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<const_wabt::Catch_*,_std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>_>
                                           *)&catch_), bVar3) {
          this_00 = __gnu_cxx::
                    __normal_iterator<const_wabt::Catch_*,_std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>_>
                    ::operator*(&__end4);
          WritePuts(this,"(",None);
          bVar3 = Catch::IsCatchAll(this_00);
          if (bVar3) {
            WritePutsNewline(this,"catch_all");
          }
          else {
            pcVar11 = Opcode::GetName((Opcode *)&Opcode::Catch_Opcode);
            WritePutsSpace(this,pcVar11);
            WriteVar(this,&this_00->var,Newline);
          }
          Indent(this);
          WriteFoldedExprList(this,&this_00->exprs);
          FlushExprTreeStack(this);
          WriteCloseNewline(this);
          __gnu_cxx::
          __normal_iterator<const_wabt::Catch_*,_std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>_>
          ::operator++(&__end4);
        }
      }
      else if (TVar1 == Delegate) {
        WritePuts(this,"(",None);
        pcVar11 = Opcode::GetName((Opcode *)&Opcode::Delegate_Opcode);
        WritePutsSpace(this,pcVar11);
        WriteVar(this,&pTVar9->delegate_target,None);
        WritePuts(this,")",Newline);
      }
    }
    WriteCloseNewline(this);
    ModuleContext::EndBlock(&this->super_ModuleContext);
  }
  else if (EVar4 == TryTable) {
    pTVar10 = cast<wabt::TryTableExpr,wabt::Expr>(expr_tree->expr);
    WritePuts(this,"(",None);
    pcVar11 = Opcode::GetName((Opcode *)&Opcode::TryTable_Opcode);
    WritePutsSpace(this,pcVar11);
    bVar2 = std::__cxx11::string::empty();
    bVar2 = (bVar2 ^ 0xff) & 1;
    if (bVar2 != 0) {
      WriteString(this,&(pTVar10->block).label,Space);
    }
    WriteTypes(this,&(pTVar10->block).decl.sig.param_types,"param");
    WriteTypes(this,&(pTVar10->block).decl.sig.result_types,"result");
    if (bVar2 == 0) {
      IVar5 = ModuleContext::GetLabelStackSize(&this->super_ModuleContext);
      Writef(this," ;; label = @%u",(ulong)IVar5);
    }
    WriteNewline(this,true);
    Indent(this);
    __end3 = std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::begin
                       (&pTVar10->catches);
    catch__1 = (TableCatch *)
               std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::end
                         (&pTVar10->catches);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
                                       *)&catch__1), bVar3) {
      pTVar12 = __gnu_cxx::
                __normal_iterator<const_wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
                ::operator*(&__end3);
      WritePuts(this,"(",None);
      switch(pTVar12->kind) {
      case Catch:
        WritePutsSpace(this,"catch");
        break;
      case CatchRef:
        WritePutsSpace(this,"catch_ref");
        break;
      case CatchAll:
        WritePutsSpace(this,"catch_all");
        break;
      case CatchAllRef:
        WritePutsSpace(this,"catch_all_ref");
      }
      if ((pTVar12->kind == Catch) || (pTVar12->kind == CatchRef)) {
        WriteVar(this,&pTVar12->tag,Space);
      }
      WriteBrVar(this,&pTVar12->target,None);
      WritePuts(this,")",Newline);
      __gnu_cxx::
      __normal_iterator<const_wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
      ::operator++(&__end3);
    }
    ModuleContext::BeginBlock(&this->super_ModuleContext,TryTable,&pTVar10->block);
    WriteFoldedExprList(this,&(pTVar10->block).exprs);
    FlushExprTreeStack(this);
    WriteCloseNewline(this);
    ModuleContext::EndBlock(&this->super_ModuleContext);
  }
  else {
    WritePuts(this,"(",None);
    WriteExpr(this,expr_tree->expr);
    Indent(this);
    FlushExprTreeVector(this,&expr_tree->children);
    WriteCloseNewline(this);
  }
  return;
}

Assistant:

void WatWriter::FlushExprTree(const ExprTree& expr_tree) {
  WABT_TRACE_ARGS(FlushExprTree, "%s", GetExprTypeName(*expr_tree.expr));
  switch (expr_tree.expr->type()) {
    case ExprType::Block:
      WritePuts("(", NextChar::None);
      WriteBeginBlock(LabelType::Block, cast<BlockExpr>(expr_tree.expr)->block,
                      Opcode::Block_Opcode.GetName());
      WriteFoldedExprList(cast<BlockExpr>(expr_tree.expr)->block.exprs);
      FlushExprTreeStack();
      WriteCloseNewline();
      EndBlock();
      break;

    case ExprType::Loop:
      WritePuts("(", NextChar::None);
      WriteBeginBlock(LabelType::Loop, cast<LoopExpr>(expr_tree.expr)->block,
                      Opcode::Loop_Opcode.GetName());
      WriteFoldedExprList(cast<LoopExpr>(expr_tree.expr)->block.exprs);
      FlushExprTreeStack();
      WriteCloseNewline();
      EndBlock();
      break;

    case ExprType::If: {
      auto if_expr = cast<IfExpr>(expr_tree.expr);
      WritePuts("(", NextChar::None);
      WriteBeginBlock(LabelType::If, if_expr->true_,
                      Opcode::If_Opcode.GetName());
      FlushExprTreeVector(expr_tree.children);
      WriteOpenNewline("then");
      WriteFoldedExprList(if_expr->true_.exprs);
      FlushExprTreeStack();
      WriteCloseNewline();
      if (!if_expr->false_.empty()) {
        WriteOpenNewline("else");
        WriteFoldedExprList(if_expr->false_);
        FlushExprTreeStack();
        WriteCloseNewline();
      }
      WriteCloseNewline();
      EndBlock();
      break;
    }

    case ExprType::Try: {
      auto try_expr = cast<TryExpr>(expr_tree.expr);
      WritePuts("(", NextChar::None);
      WriteBeginBlock(LabelType::Try, try_expr->block,
                      Opcode::Try_Opcode.GetName());
      WriteOpenNewline("do");
      FlushExprTreeVector(expr_tree.children);
      WriteFoldedExprList(try_expr->block.exprs);
      FlushExprTreeStack();
      WriteCloseNewline();
      switch (try_expr->kind) {
        case TryKind::Catch:
          for (const Catch& catch_ : try_expr->catches) {
            WritePuts("(", NextChar::None);
            if (catch_.IsCatchAll()) {
              WritePutsNewline("catch_all");
            } else {
              WritePutsSpace(Opcode::Catch_Opcode.GetName());
              WriteVar(catch_.var, NextChar::Newline);
            }
            Indent();
            WriteFoldedExprList(catch_.exprs);
            FlushExprTreeStack();
            WriteCloseNewline();
          }
          break;
        case TryKind::Delegate:
          WritePuts("(", NextChar::None);
          WritePutsSpace(Opcode::Delegate_Opcode.GetName());
          WriteVar(try_expr->delegate_target, NextChar::None);
          WritePuts(")", NextChar::Newline);
          break;
        case TryKind::Plain:
          // Nothing to do.
          break;
      }
      WriteCloseNewline();
      EndBlock();
      break;
    }

    case ExprType::TryTable: {
      auto try_table_expr = cast<TryTableExpr>(expr_tree.expr);

      WritePuts("(", NextChar::None);
      // copied from WriteBeginBlock, try_table needs to push label *after*
      // writing catches
      WritePutsSpace(Opcode::TryTable_Opcode.GetName());
      bool has_label = !try_table_expr->block.label.empty();
      if (has_label) {
        WriteString(try_table_expr->block.label, NextChar::Space);
      }
      WriteTypes(try_table_expr->block.decl.sig.param_types, "param");
      WriteTypes(try_table_expr->block.decl.sig.result_types, "result");
      if (!has_label) {
        Writef(" ;; label = @%" PRIindex, GetLabelStackSize());
      }
      WriteNewline(FORCE_NEWLINE);
      Indent();

      for (const auto& catch_ : try_table_expr->catches) {
        WritePuts("(", NextChar::None);
        switch (catch_.kind) {
          case CatchKind::Catch:
            WritePutsSpace("catch");
            break;
          case CatchKind::CatchRef:
            WritePutsSpace("catch_ref");
            break;
          case CatchKind::CatchAll:
            WritePutsSpace("catch_all");
            break;
          case CatchKind::CatchAllRef:
            WritePutsSpace("catch_all_ref");
            break;
        }
        if (catch_.kind == CatchKind::Catch ||
            catch_.kind == CatchKind::CatchRef) {
          WriteVar(catch_.tag, NextChar::Space);
        }
        WriteBrVar(catch_.target, NextChar::None);
        WritePuts(")", NextChar::Newline);
      }

      BeginBlock(LabelType::TryTable, try_table_expr->block);

      WriteFoldedExprList(try_table_expr->block.exprs);
      FlushExprTreeStack();
      WriteCloseNewline();
      EndBlock();
      break;
    }

    default: {
      WritePuts("(", NextChar::None);
      WriteExpr(expr_tree.expr);
      Indent();
      FlushExprTreeVector(expr_tree.children);
      WriteCloseNewline();
      break;
    }
  }
}